

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O0

Vector3d * gmath::averageAngleAxis(int n,Vector3d *v)

{
  double v0;
  double v1;
  pointer v2;
  bool bVar1;
  double *pdVar2;
  vector<double,_std::allocator<double>_> *this;
  SVector<double,_3> *in_RDX;
  int in_ESI;
  SVector<double,_3> *in_RDI;
  double in_stack_00000060;
  vector<double,_std::allocator<double>_> fvec;
  double x [3];
  Matrix33d R;
  double phi;
  Vector3d N;
  Matrix33d R1;
  Matrix33d R0;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  allocator_type *in_stack_fffffffffffffd90;
  SMatrix<double,_3,_3> *in_stack_fffffffffffffd98;
  SMatrix<double,_3,_3> *in_stack_fffffffffffffda0;
  Matrix33d *in_stack_fffffffffffffda8;
  Vector3d *in_stack_fffffffffffffec8;
  Matrix33d *in_stack_fffffffffffffed0;
  double in_stack_fffffffffffffed8;
  void *in_stack_fffffffffffffee0;
  double *in_stack_fffffffffffffee8;
  double *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  lmdifFct in_stack_ffffffffffffff00;
  long *in_stack_ffffffffffffff40;
  double *in_stack_ffffffffffffff48;
  
  if (in_ESI < 1) {
    SVector<double,_3>::SVector(in_RDI);
  }
  else if (in_ESI == 1) {
    SVector<double,_3>::SVector
              ((SVector<double,_3> *)in_stack_fffffffffffffd90,
               (SVector<double,_3> *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  }
  else if (in_ESI == 2) {
    createR((Vector3d *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    createR((Vector3d *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    SVector<double,_3>::SVector((SVector<double,_3> *)&stack0xffffffffffffff40);
    transpose<double,3,3>(in_stack_fffffffffffffd98);
    operator*(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    recoverAngleAxis(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    createR((Vector3d *)
            fvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_start,in_stack_00000060);
    operator*(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    recoverAngleAxis(in_stack_fffffffffffffda8);
  }
  else {
    std::allocator<double>::allocator((allocator<double> *)0x1b73d8);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffda0,
               (size_type)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    std::allocator<double>::~allocator((allocator<double> *)0x1b73f8);
    pdVar2 = SVector<double,_3>::operator[](in_RDX,0);
    v0 = *pdVar2;
    pdVar2 = SVector<double,_3>::operator[](in_RDX,1);
    v1 = *pdVar2;
    this = (vector<double,_std::allocator<double>_> *)SVector<double,_3>::operator[](in_RDX,2);
    v2 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
         ._M_start;
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x1b748b);
    bVar1 = slmdif(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                   in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                   in_stack_fffffffffffffed8,(double)in_stack_fffffffffffffed0,
                   in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
    if (bVar1) {
      SVector<double,_3>::SVector(in_RDI,v0,v1,(double)v2);
    }
    else {
      SVector<double,_3>::SVector(in_RDI);
    }
    std::vector<double,_std::allocator<double>_>::~vector(this);
  }
  return in_RDI;
}

Assistant:

Vector3d averageAngleAxis(int n, Vector3d v[])
{
  if (n <= 0)
  {
    return Vector3d();
  }

  if (n == 1)
  {
    return v[0];
  }

  if (n == 2)
  {
    Matrix33d R0=createR(v[0]);
    Matrix33d R1=createR(v[1]);

    Vector3d N;
    double phi=recoverAngleAxis(transpose(R1)*R0, N);
    Matrix33d R=R1*createR(N, phi/2);

    return recoverAngleAxis(R);
  }

  // for all n >= 3

  double x[3];
  std::vector<double> fvec(n);

  // taking first rotation as start value

  x[0]=v[0][0];
  x[1]=v[0][1];
  x[2]=v[0][2];

  // optimize

  if (slmdif(averageAngleAxisOpt, n, 3, x, fvec.data(), v, 1e-9, 1e-9))
  {
    return Vector3d(x[0], x[1], x[2]);
  }

  return Vector3d();
}